

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdentifierExpression.cpp
# Opt level: O1

void __thiscall hdc::IdentifierExpression::IdentifierExpression(IdentifierExpression *this)

{
  Expression::Expression(&this->super_Expression);
  (this->super_Expression).super_Statement.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_001971f8;
  (this->name).lexem._M_dataplus._M_p = (pointer)&(this->name).lexem.field_2;
  (this->name).lexem._M_string_length = 0;
  (this->name).lexem.field_2._M_local_buf[0] = '\0';
  (this->alias).lexem._M_dataplus._M_p = (pointer)&(this->alias).lexem.field_2;
  (this->alias).lexem._M_string_length = 0;
  (this->alias).lexem.field_2._M_local_buf[0] = '\0';
  this->alias_flag = false;
  ASTNode::setKind((ASTNode *)this,AST_IDENTIFIER);
  this->symbol = (Symbol *)0x0;
  this->idxOverloaded = -1;
  return;
}

Assistant:

IdentifierExpression::IdentifierExpression() {
    this->alias_flag = false;
    this->setKind(AST_IDENTIFIER);
    this->symbol = nullptr;
    this->idxOverloaded = -1;
}